

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

void Gia_ManQuantExist_rec(Gia_Man_t *p,int iObj,int *pRes)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int Lits1 [2];
  int Lits0 [2];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] == p->nTravIds) {
    if (iObj < 0) {
LAB_00205cce:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    uVar7 = iObj * 2;
    uVar5 = (p->vCopiesTwo).nSize;
    if (uVar5 == uVar7 || SBORROW4(uVar5,uVar7) != (int)(uVar5 + iObj * -2) < 0) goto LAB_00205cce;
    piVar4 = (p->vCopiesTwo).pArray + uVar7;
    piVar3 = piVar4 + 1;
    *pRes = *piVar4;
    piVar4 = pRes;
LAB_00205cba:
    piVar4[1] = *piVar3;
    return;
  }
  p->pTravIds[iObj] = p->nTravIds;
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar1 = *(ulong *)(p->pObjs + (uint)iObj);
  if ((~(uint)uVar1 & 0x9fffffff) == 0) {
    pRes[0] = 0;
    pRes[1] = 1;
    uVar7 = iObj * 2;
    uVar5 = (p->vCopiesTwo).nSize;
    if (uVar5 != uVar7 && SBORROW4(uVar5,uVar7) == (int)(uVar5 + iObj * -2) < 0) {
      piVar3 = pRes + 1;
      piVar4 = (p->vCopiesTwo).pArray + uVar7;
      *piVar4 = 0;
      goto LAB_00205cba;
    }
    goto LAB_00205cce;
  }
  iVar6 = iObj - ((uint)uVar1 & 0x1fffffff);
  iVar2 = Gia_ManQuantCheckSupp(p,iVar6,p->iSuppPi);
  if (iVar2 == 0) {
    if (iVar6 < 0) goto LAB_00205d4a;
    local_38 = iVar6 * 2;
    local_34 = local_38;
  }
  else {
    Gia_ManQuantExist_rec(p,iVar6,(int *)&local_38);
  }
  uVar5 = (uint)(uVar1 >> 0x20);
  iVar6 = iObj - (uVar5 & 0x1fffffff);
  iVar2 = Gia_ManQuantCheckSupp(p,iVar6,p->iSuppPi);
  if (iVar2 == 0) {
    if (iVar6 < 0) {
LAB_00205d4a:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_40 = iVar6 * 2;
    local_3c = local_40;
  }
  else {
    Gia_ManQuantExist_rec(p,iVar6,(int *)&local_40);
  }
  if ((-1 < (int)local_38) && (-1 < (int)local_40)) {
    uVar7 = (uint)(uVar1 >> 0x1d) & 1;
    uVar5 = uVar5 >> 0x1d & 1;
    iVar2 = Gia_ManHashAnd(p,local_38 ^ uVar7,local_40 ^ uVar5);
    *pRes = iVar2;
    if ((-1 < (int)local_34) && (-1 < (int)local_3c)) {
      iVar2 = Gia_ManHashAnd(p,local_34 ^ uVar7,local_3c ^ uVar5);
      pRes[1] = iVar2;
      uVar7 = iObj * 2;
      uVar5 = (p->vCopiesTwo).nSize;
      if (uVar5 == uVar7 || SBORROW4(uVar5,uVar7) != (int)(uVar5 + iObj * -2) < 0)
      goto LAB_00205cce;
      piVar4 = (p->vCopiesTwo).pArray + uVar7;
      piVar3 = pRes + 1;
      *piVar4 = *pRes;
      goto LAB_00205cba;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Gia_ManQuantExist_rec( Gia_Man_t * p, int iObj, int pRes[2] )
{
    Gia_Obj_t * pObj;
    int Lits0[2], Lits1[2], pFans[2], fCompl[2];
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
    {
        Gia_ObjCopyGetTwoArray( p, iObj, pRes );
        return;
    }
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        pRes[0] = 0; pRes[1] = 1;
        Gia_ObjCopySetTwoArray( p, iObj, pRes );
        return;
    }
    pFans[0]  = Gia_ObjFaninId0( pObj, iObj );
    pFans[1]  = Gia_ObjFaninId1( pObj, iObj );
    fCompl[0] = Gia_ObjFaninC0( pObj );
    fCompl[1] = Gia_ObjFaninC1( pObj );
    if ( Gia_ManQuantCheckSupp(p, pFans[0], p->iSuppPi) )
        Gia_ManQuantExist_rec( p, pFans[0], Lits0 );
    else
        Lits0[0] = Lits0[1] = Abc_Var2Lit( pFans[0], 0 );
    if ( Gia_ManQuantCheckSupp(p, pFans[1], p->iSuppPi) )
        Gia_ManQuantExist_rec( p, pFans[1], Lits1 );
    else
        Lits1[0] = Lits1[1] = Abc_Var2Lit( pFans[1], 0 );
    pRes[0] = Gia_ManHashAnd( p, Abc_LitNotCond(Lits0[0], fCompl[0]), Abc_LitNotCond(Lits1[0], fCompl[1]) );
    pRes[1] = Gia_ManHashAnd( p, Abc_LitNotCond(Lits0[1], fCompl[0]), Abc_LitNotCond(Lits1[1], fCompl[1]) );
    Gia_ObjCopySetTwoArray( p, iObj, pRes );
}